

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_utils.h
# Opt level: O1

GenValidUsageXrHandleInfo * __thiscall
HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo>::get
          (HandleInfoBase<XrEyeTrackerFB_T_*,_GenValidUsageXrHandleInfo> *this,
          XrEyeTrackerFB_T *handle)

{
  ulong uVar1;
  GenValidUsageXrHandleInfo *pGVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __hash_code __code;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  UniqueLock lock;
  string local_48;
  unique_lock<std::mutex> local_28;
  
  if (handle == (XrEyeTrackerFB_T *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Null handle passed to HandleInfoBase::get()","");
    reportInternalError(&local_48);
  }
  local_28._M_device = &this->dispatch_mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  uVar1 = (this->info_map_)._M_h._M_bucket_count;
  uVar4 = (ulong)handle % uVar1;
  p_Var5 = (this->info_map_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     (XrEyeTrackerFB_T *)p_Var5->_M_nxt[1]._M_nxt != handle)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, (XrEyeTrackerFB_T *)p_Var3[1]._M_nxt == handle)) goto LAB_002c670b;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_002c670b:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Handle passed to HandleInfoBase::insert() not inserted","");
    reportInternalError(&local_48);
  }
  pGVar2 = (GenValidUsageXrHandleInfo *)p_Var3[2]._M_nxt;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return pGVar2;
}

Assistant:

inline InfoType *HandleInfoBase<HandleType, InfoType>::get(HandleType handle) {
    if (handle == XR_NULL_HANDLE) {
        reportInternalError("Null handle passed to HandleInfoBase::get()");
    }
    // Try to find the handle in the appropriate map
    UniqueLock lock(dispatch_mutex_);
    auto entry_returned = info_map_.find(handle);
    if (entry_returned == info_map_.end()) {
        reportInternalError("Handle passed to HandleInfoBase::insert() not inserted");
    }
    return entry_returned->second.get();
}